

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,HeapType type)

{
  HeapType HVar1;
  long *plVar2;
  uint uVar3;
  ostream *poVar4;
  Struct *pSVar5;
  long *plVar6;
  Type TVar7;
  long lVar8;
  char *pcVar9;
  long *plVar10;
  undefined8 unaff_R12;
  ulong uVar11;
  __hash_code __code;
  undefined1 local_98 [8];
  TypeNames names;
  HeapType local_48;
  HeapType type_local;
  HeapType local_38;
  
  local_48.id = type.id;
  if (0x7c < type.id) {
    local_38 = (HeapType)type_local.id;
    type_local.id = type.id;
    if ((this->generator).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->generator)._M_invoker)((TypeNames *)local_98,(_Any_data *)&this->generator,&type_local)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(type ",6);
    poVar4 = Name::print((Name *)local_98,this->os);
    type_local.id._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&type_local,1);
    if (*(char *)type.id == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(; temp ;) ",0xb);
    }
    HVar1.id = *(uintptr_t *)(type.id + 8);
    if ((HVar1.id == 0) && (*(char *)(type.id + 1) != '\x01')) {
      uVar11 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(sub ",5);
      if (*(char *)(type.id + 1) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(this->os,"final ",6);
      }
      uVar11 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      if (HVar1.id != 0) {
        printHeapTypeName(this,HVar1);
        type_local.id._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
      }
    }
    if (*(int *)(type.id + 4) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(shared ",8);
    }
    HVar1.id = *(uintptr_t *)(type.id + 0x18);
    if (HVar1.id != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(describes ",0xb);
      printHeapTypeName(this,HVar1);
      type_local.id._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
    }
    HVar1.id = *(uintptr_t *)(type.id + 0x10);
    if (HVar1.id != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(descriptor ",0xc);
      printHeapTypeName(this,HVar1);
      type_local.id._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
    }
    switch(*(undefined4 *)(type.id + 0x30)) {
    case 0:
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x743);
    case 1:
      _type_local = HeapType::getSignature(&local_48);
      print(this,(Signature *)&type_local);
      break;
    case 2:
      pSVar5 = HeapType::getStruct(&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(struct",7);
      names.fieldNames._M_h._M_single_bucket._4_4_ = (uint)uVar11;
      if ((pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(this->os," (field ",8);
          plVar2 = *(long **)(names.name.super_IString.str._M_str +
                             (uVar11 % (ulong)names.fieldNames._M_h._M_buckets) * 8);
          uVar3 = (uint)uVar11;
          plVar6 = (long *)0x0;
          if ((plVar2 != (long *)0x0) &&
             (plVar6 = plVar2, plVar10 = (long *)*plVar2, uVar3 != *(uint *)((long *)*plVar2 + 1)))
          {
            while (plVar2 = (long *)*plVar10, plVar2 != (long *)0x0) {
              plVar6 = (long *)0x0;
              if (((ulong)*(uint *)(plVar2 + 1) % (ulong)names.fieldNames._M_h._M_buckets !=
                   uVar11 % (ulong)names.fieldNames._M_h._M_buckets) ||
                 (plVar6 = plVar10, plVar10 = plVar2, uVar3 == *(uint *)(plVar2 + 1)))
              goto LAB_00cc3340;
            }
            plVar6 = (long *)0x0;
          }
LAB_00cc3340:
          if (plVar6 == (long *)0x0) {
            lVar8 = 0;
          }
          else {
            lVar8 = *plVar6;
          }
          if (lVar8 != 0) {
            poVar4 = Name::print((Name *)(lVar8 + 0x10),this->os);
            type_local.id._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&type_local,1);
          }
          print(this,(pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11);
          type_local.id._0_1_ = 0x29;
          std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
          uVar11 = (ulong)(uVar3 + 1);
        } while (uVar11 < (ulong)((long)(pSVar5->fields).
                                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pSVar5->fields).
                                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->os,")",1);
      uVar11 = (ulong)names.fieldNames._M_h._M_single_bucket._4_4_;
      break;
    case 3:
      HeapType::getArray(&type_local);
      print(this,(Array *)&type_local);
      break;
    case 4:
      TVar7.id = (uintptr_t)HeapType::getContinuation(&local_48);
      type_local.id = TVar7.id;
      print(this,(Continuation *)&type_local);
    }
    HVar1.id = local_48.id;
    if (0x7c < local_48.id) {
      if (*(long *)(local_48.id + 0x10) != 0) {
        type_local.id._0_1_ = 0x29;
        std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
      }
      if (0x7c < HVar1.id) {
        if (*(long *)(HVar1.id + 0x18) != 0) {
          type_local.id._0_1_ = 0x29;
          std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
        }
        if (0x7c < HVar1.id) {
          uVar3 = *(uint *)(HVar1.id + 4);
          goto LAB_00cc3455;
        }
      }
    }
    uVar3 = (uint)((HVar1.id & 4) == 0);
LAB_00cc3455:
    if (uVar3 == 0) {
      type_local.id._0_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
    }
    if ((char)uVar11 != '\0') {
      type_local.id._0_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
    }
    type_local.id._0_1_ = 0x29;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&type_local,1);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&names.name.super_IString.str._M_str);
    return poVar4;
  }
  if ((type.id & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(shared ",8);
  }
  uVar3 = (uint)type.id & 0x7b;
  switch(uVar3 << 0x1d | uVar3 - 8 >> 3) {
  case 0:
    poVar4 = this->os;
    pcVar9 = "extern";
    goto LAB_00cc3554;
  case 1:
    poVar4 = this->os;
    pcVar9 = "func";
    goto LAB_00cc3565;
  case 2:
    poVar4 = this->os;
    pcVar9 = "cont";
    goto LAB_00cc3565;
  case 3:
    poVar4 = this->os;
    pcVar9 = "any";
    goto LAB_00cc3576;
  case 4:
    poVar4 = this->os;
    pcVar9 = "eq";
    lVar8 = 2;
    break;
  case 5:
    poVar4 = this->os;
    pcVar9 = "i31";
    goto LAB_00cc3576;
  case 6:
    poVar4 = this->os;
    pcVar9 = "struct";
    goto LAB_00cc3554;
  case 7:
    poVar4 = this->os;
    pcVar9 = "array";
    goto LAB_00cc351f;
  case 8:
    poVar4 = this->os;
    pcVar9 = "exn";
LAB_00cc3576:
    lVar8 = 3;
    break;
  case 9:
    poVar4 = this->os;
    pcVar9 = "string";
    goto LAB_00cc3554;
  case 10:
    poVar4 = this->os;
    pcVar9 = "none";
LAB_00cc3565:
    lVar8 = 4;
    break;
  case 0xb:
    poVar4 = this->os;
    pcVar9 = "noextern";
    lVar8 = 8;
    break;
  case 0xc:
    poVar4 = this->os;
    pcVar9 = "nofunc";
    goto LAB_00cc3554;
  case 0xd:
    poVar4 = this->os;
    pcVar9 = "nocont";
LAB_00cc3554:
    lVar8 = 6;
    break;
  case 0xe:
    poVar4 = this->os;
    pcVar9 = "noexn";
LAB_00cc351f:
    lVar8 = 5;
    break;
  default:
    goto switchD_00cc30d4_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,lVar8);
switchD_00cc30d4_default:
  if ((type.id & 4) != 0) {
    local_98[0] = ')';
    std::__ostream_insert<char,std::char_traits<char>>(this->os,local_98,1);
  }
  return this->os;
}

Assistant:

std::ostream& TypePrinter::print(HeapType type) {
  if (type.isBasic()) {
    if (type.isShared()) {
      os << "(shared ";
    }
    switch (type.getBasic(Unshared)) {
      case HeapType::ext:
        os << "extern";
        break;
      case HeapType::func:
        os << "func";
        break;
      case HeapType::cont:
        os << "cont";
        break;
      case HeapType::any:
        os << "any";
        break;
      case HeapType::eq:
        os << "eq";
        break;
      case HeapType::i31:
        os << "i31";
        break;
      case HeapType::struct_:
        os << "struct";
        break;
      case HeapType::array:
        os << "array";
        break;
      case HeapType::exn:
        os << "exn";
        break;
      case HeapType::string:
        os << "string";
        break;
      case HeapType::none:
        os << "none";
        break;
      case HeapType::noext:
        os << "noextern";
        break;
      case HeapType::nofunc:
        os << "nofunc";
        break;
      case HeapType::nocont:
        os << "nocont";
        break;
      case HeapType::noexn:
        os << "noexn";
        break;
    }
    if (type.isShared()) {
      os << ')';
    }
    return os;
  }

  auto names = generator(type);

  os << "(type ";
  names.name.print(os) << ' ';

  if (isTemp(type)) {
    os << "(; temp ;) ";
  }

  bool useSub = false;
  auto super = type.getDeclaredSuperType();
  if (super || type.isOpen()) {
    useSub = true;
    os << "(sub ";
    if (!type.isOpen()) {
      os << "final ";
    }
    if (super) {
      printHeapTypeName(*super);
      os << ' ';
    }
  }
  if (type.isShared()) {
    os << "(shared ";
  }
  if (auto desc = type.getDescribedType()) {
    os << "(describes ";
    printHeapTypeName(*desc);
    os << ' ';
  }
  if (auto desc = type.getDescriptorType()) {
    os << "(descriptor ";
    printHeapTypeName(*desc);
    os << ' ';
  }
  switch (type.getKind()) {
    case HeapTypeKind::Func:
      print(type.getSignature());
      break;
    case HeapTypeKind::Struct:
      print(type.getStruct(), names.fieldNames);
      break;
    case HeapTypeKind::Array:
      print(type.getArray());
      break;
    case HeapTypeKind::Cont:
      print(type.getContinuation());
      break;
    case HeapTypeKind::Basic:
      WASM_UNREACHABLE("unexpected kind");
  }
  if (type.getDescriptorType()) {
    os << ')';
  }
  if (type.getDescribedType()) {
    os << ')';
  }
  if (type.isShared()) {
    os << ')';
  }
  if (useSub) {
    os << ')';
  }
  return os << ')';
}